

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

void setDateTime(QDateTimeData *d,QDate date,QTime time)

{
  QDateTimePrivate *pQVar1;
  uint uVar2;
  undefined8 uVar3;
  QDateTimePrivate *pQVar4;
  QTime QVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  lVar7 = date.jd + -0x253d8c;
  QVar5.mds = 0;
  bVar9 = date.jd + 0xb69eeff91fU < 0x16d3e147974;
  if (!bVar9) {
    lVar7 = 0;
    QVar5.mds = time.mds;
  }
  if ((uint)time.mds < 86400000) {
    QVar5.mds = time.mds;
  }
  uVar6 = bVar9 + 4 + (uint)bVar9;
  if (86399999 < (uint)QVar5.mds) {
    QVar5.mds = 0;
    uVar6 = (uint)bVar9 * 2;
  }
  uVar2 = QVar5.mds + 0xfad9a400;
  if (0 >= QVar5.mds || lVar7 >= 0) {
    uVar2 = QVar5.mds;
  }
  lVar7 = (ulong)(0 < QVar5.mds && lVar7 < 0) + lVar7;
  bVar9 = SEXT816(lVar7 * 86400000) == SEXT816(lVar7) * SEXT416(86400000);
  lVar8 = lVar7 * 86400000;
  if (bVar9) {
    lVar8 = lVar7 * 86400000 + (long)(int)uVar2;
  }
  if (!bVar9 || SCARRY8(lVar7 * 86400000,(long)(int)uVar2)) {
    uVar6 = 0;
    lVar8 = 0;
  }
  if (((ulong)*d & 1) != 0) {
    if (lVar8 + 0x80000000000000U >> 0x38 == 0) {
      d->d = (QDateTimePrivate *)((ulong)(*(uint *)d & 0x31 | uVar6) | lVar8 << 8);
    }
    else {
      pQVar4 = (QDateTimePrivate *)operator_new(0x20);
      pQVar4->super_QSharedData = (QAtomicInt)0x0;
      pQVar4->m_status = (QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>)0x0;
      pQVar4->m_msecs = 0;
      pQVar4->m_offsetFromUtc = 0;
      QTimeZone::QTimeZone(&pQVar4->m_timeZone);
      pQVar1 = d->d;
      (pQVar4->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
      super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = (uint)pQVar1 & 0xfe;
      pQVar4->m_msecs = (long)pQVar1 >> 8;
      (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 1;
      d->d = pQVar4;
    }
  }
  pQVar1 = d->d;
  if (((ulong)pQVar1 & 1) == 0) {
    if ((pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      pQVar4 = (QDateTimePrivate *)operator_new(0x20);
      (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 0;
      uVar3 = *(undefined8 *)((long)&pQVar1->m_msecs + 4);
      *(undefined8 *)&pQVar4->m_status = *(undefined8 *)&pQVar1->m_status;
      *(undefined8 *)((long)&pQVar4->m_msecs + 4) = uVar3;
      QTimeZone::QTimeZone(&pQVar4->m_timeZone,&pQVar1->m_timeZone);
      (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 1;
      pQVar1 = d->d;
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i == 0) &&
         (pQVar1 = d->d, pQVar1 != (QDateTimePrivate *)0x0)) {
        QTimeZone::~QTimeZone(&pQVar1->m_timeZone);
        operator_delete(pQVar1,0x20);
      }
      d->d = pQVar4;
    }
    d->d->m_msecs = lVar8;
    (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
         (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
         super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i & 0xffffff31;
    (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
         (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
         super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i | uVar6;
  }
  return;
}

Assistant:

static void setDateTime(QDateTimeData &d, QDate date, QTime time)
{
    // If the date is valid and the time is not we set time to 00:00:00
    if (!time.isValid() && date.isValid())
        time = QTime::fromMSecsSinceStartOfDay(0);

    QDateTimePrivate::StatusFlags newStatus = { };

    // Set date value and status
    qint64 days = 0;
    if (date.isValid()) {
        days = date.toJulianDay() - JULIAN_DAY_FOR_EPOCH;
        newStatus = QDateTimePrivate::ValidDate;
    }

    // Set time value and status
    int ds = 0;
    if (time.isValid()) {
        ds = time.msecsSinceStartOfDay();
        newStatus |= QDateTimePrivate::ValidTime;
    }
    Q_ASSERT(ds < MSECS_PER_DAY);
    // Only the later parts of the very first day are representable - its start
    // would overflow - so get ds the same side of 0 as days:
    if (days < 0 && ds > 0) {
        days++;
        ds -= MSECS_PER_DAY;
    }

    // Check in representable range:
    qint64 msecs = 0;
    if (daysAndMillisOverflow(days, qint64(ds), &msecs)) {
        newStatus = QDateTimePrivate::StatusFlags{};
        msecs = 0;
    }
    if (d.isShort()) {
        // let's see if we can keep this short
        if (msecsCanBeSmall(msecs)) {
            // yes, we can
            d.data.msecs = qintptr(msecs);
            d.data.status &= ~(QDateTimePrivate::ValidityMask | QDateTimePrivate::DaylightMask).toInt();
            d.data.status |= newStatus.toInt();
        } else {
            // nope...
            d.detach();
        }
    }
    if (!d.isShort()) {
        d.detach();
        d->m_msecs = msecs;
        d->m_status &= ~(QDateTimePrivate::ValidityMask | QDateTimePrivate::DaylightMask);
        d->m_status |= newStatus;
    }
}